

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expanddims.cpp
# Opt level: O1

int __thiscall
ncnn::ExpandDims::forward(ExpandDims *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  int _h;
  void *pvVar1;
  int *piVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  long lVar9;
  int iVar10;
  long lVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  Mat local_78;
  
  iVar8 = bottom_blob->dims;
  pvVar1 = (this->axes).data;
  if ((pvVar1 == (void *)0x0) || ((long)(this->axes).c * (this->axes).cstep == 0)) {
    bVar13 = this->expand_w != 0;
    bVar14 = this->expand_h != 0;
    bVar15 = this->expand_c != 0;
  }
  else {
    lVar11 = (long)(this->axes).w;
    if (lVar11 < 1) {
      bVar13 = false;
      bVar14 = false;
      bVar15 = false;
    }
    else {
      lVar9 = 0;
      bVar15 = false;
      bVar14 = false;
      bVar13 = false;
      do {
        iVar10 = *(int *)((long)pvVar1 + lVar9 * 4);
        iVar10 = (iVar10 >> 0x1f & iVar8 + 1U) + iVar10;
        bVar3 = bVar14;
        if (iVar10 == 0) {
          bVar3 = true;
        }
        if (iVar8 != 1) {
          bVar3 = bVar14;
        }
        bVar14 = bVar3;
        bVar4 = bVar13;
        if (iVar10 == 1) {
          bVar14 = true;
          bVar4 = true;
        }
        if (iVar8 != 1) {
          bVar4 = bVar13;
        }
        bVar12 = bVar15;
        if (iVar10 == 0) {
          bVar12 = true;
        }
        bVar13 = bVar4;
        if (iVar10 == 2) {
          bVar13 = true;
        }
        if (iVar8 != 2) {
          bVar12 = bVar15;
          bVar14 = bVar3;
          bVar13 = bVar4;
        }
        bVar15 = bVar12;
        lVar9 = lVar9 + 1;
      } while (lVar11 != lVar9);
    }
  }
  iVar10 = bottom_blob->w;
  _h = bottom_blob->h;
  if (top_blob != bottom_blob) {
    piVar2 = bottom_blob->refcount;
    if (piVar2 != (int *)0x0) {
      LOCK();
      *piVar2 = *piVar2 + 1;
      UNLOCK();
    }
    piVar2 = top_blob->refcount;
    if (piVar2 != (int *)0x0) {
      LOCK();
      *piVar2 = *piVar2 + -1;
      UNLOCK();
      if (*piVar2 == 0) {
        if (top_blob->allocator == (Allocator *)0x0) {
          if (top_blob->data != (void *)0x0) {
            free(top_blob->data);
          }
        }
        else {
          (*top_blob->allocator->_vptr_Allocator[3])();
        }
      }
    }
    top_blob->cstep = 0;
    top_blob->data = (void *)0x0;
    top_blob->refcount = (int *)0x0;
    *(undefined8 *)((long)&top_blob->refcount + 4) = 0;
    *(undefined8 *)((long)&top_blob->elemsize + 4) = 0;
    top_blob->dims = 0;
    top_blob->w = 0;
    top_blob->h = 0;
    top_blob->d = 0;
    top_blob->c = 0;
    piVar2 = bottom_blob->refcount;
    top_blob->data = bottom_blob->data;
    top_blob->refcount = piVar2;
    top_blob->elemsize = bottom_blob->elemsize;
    top_blob->elempack = bottom_blob->elempack;
    top_blob->allocator = bottom_blob->allocator;
    iVar5 = bottom_blob->w;
    iVar6 = bottom_blob->h;
    iVar7 = bottom_blob->d;
    top_blob->dims = bottom_blob->dims;
    top_blob->w = iVar5;
    top_blob->h = iVar6;
    top_blob->d = iVar7;
    top_blob->c = bottom_blob->c;
    top_blob->cstep = bottom_blob->cstep;
  }
  if (iVar8 != 2) {
    if (iVar8 != 1) goto LAB_00473a2f;
    if ((bool)(bVar13 & bVar14)) {
      Mat::reshape(&local_78,bottom_blob,1,iVar10,1,opt->blob_allocator);
      if (&local_78 != top_blob) {
        if (local_78.refcount != (int *)0x0) {
          LOCK();
          *local_78.refcount = *local_78.refcount + 1;
          UNLOCK();
        }
        piVar2 = top_blob->refcount;
        if (piVar2 != (int *)0x0) {
          LOCK();
          *piVar2 = *piVar2 + -1;
          UNLOCK();
          if (*piVar2 == 0) {
            if (top_blob->allocator == (Allocator *)0x0) {
              if (top_blob->data != (void *)0x0) {
                free(top_blob->data);
              }
            }
            else {
              (*top_blob->allocator->_vptr_Allocator[3])();
            }
          }
        }
        top_blob->cstep = 0;
        top_blob->data = (void *)0x0;
        top_blob->refcount = (int *)0x0;
        *(undefined8 *)((long)&top_blob->refcount + 4) = 0;
        *(undefined8 *)((long)&top_blob->elemsize + 4) = 0;
        top_blob->dims = 0;
        top_blob->w = 0;
        top_blob->h = 0;
        top_blob->d = 0;
        top_blob->c = 0;
        top_blob->data = local_78.data;
        top_blob->refcount = local_78.refcount;
        top_blob->elemsize = local_78.elemsize;
        top_blob->elempack = local_78.elempack;
        top_blob->allocator = local_78.allocator;
        top_blob->dims = local_78.dims;
        top_blob->w = local_78.w;
        top_blob->h = local_78.h;
        top_blob->d = local_78.d;
        top_blob->c = local_78.c;
        top_blob->cstep = local_78.cstep;
      }
      if (local_78.refcount == (int *)0x0) goto LAB_00473a2f;
      LOCK();
      *local_78.refcount = *local_78.refcount + -1;
      UNLOCK();
      if (*local_78.refcount != 0) goto LAB_00473a2f;
      if (local_78.allocator != (Allocator *)0x0) {
        (*(local_78.allocator)->_vptr_Allocator[3])();
        goto LAB_00473a2f;
      }
    }
    else if (bVar13) {
      Mat::reshape(&local_78,bottom_blob,1,iVar10,opt->blob_allocator);
      if (&local_78 != top_blob) {
        if (local_78.refcount != (int *)0x0) {
          LOCK();
          *local_78.refcount = *local_78.refcount + 1;
          UNLOCK();
        }
        piVar2 = top_blob->refcount;
        if (piVar2 != (int *)0x0) {
          LOCK();
          *piVar2 = *piVar2 + -1;
          UNLOCK();
          if (*piVar2 == 0) {
            if (top_blob->allocator == (Allocator *)0x0) {
              if (top_blob->data != (void *)0x0) {
                free(top_blob->data);
              }
            }
            else {
              (*top_blob->allocator->_vptr_Allocator[3])();
            }
          }
        }
        top_blob->cstep = 0;
        top_blob->data = (void *)0x0;
        top_blob->refcount = (int *)0x0;
        *(undefined8 *)((long)&top_blob->refcount + 4) = 0;
        *(undefined8 *)((long)&top_blob->elemsize + 4) = 0;
        top_blob->dims = 0;
        top_blob->w = 0;
        top_blob->h = 0;
        top_blob->d = 0;
        top_blob->c = 0;
        top_blob->data = local_78.data;
        top_blob->refcount = local_78.refcount;
        top_blob->elemsize = local_78.elemsize;
        top_blob->elempack = local_78.elempack;
        top_blob->allocator = local_78.allocator;
        top_blob->dims = local_78.dims;
        top_blob->w = local_78.w;
        top_blob->h = local_78.h;
        top_blob->d = local_78.d;
        top_blob->c = local_78.c;
        top_blob->cstep = local_78.cstep;
      }
      if (local_78.refcount == (int *)0x0) goto LAB_00473a2f;
      LOCK();
      *local_78.refcount = *local_78.refcount + -1;
      UNLOCK();
      if (*local_78.refcount != 0) goto LAB_00473a2f;
      if (local_78.allocator != (Allocator *)0x0) {
        (*(local_78.allocator)->_vptr_Allocator[3])();
        goto LAB_00473a2f;
      }
    }
    else {
      if (!bVar14) goto LAB_00473a2f;
      Mat::reshape(&local_78,bottom_blob,iVar10,1,opt->blob_allocator);
      if (&local_78 != top_blob) {
        if (local_78.refcount != (int *)0x0) {
          LOCK();
          *local_78.refcount = *local_78.refcount + 1;
          UNLOCK();
        }
        piVar2 = top_blob->refcount;
        if (piVar2 != (int *)0x0) {
          LOCK();
          *piVar2 = *piVar2 + -1;
          UNLOCK();
          if (*piVar2 == 0) {
            if (top_blob->allocator == (Allocator *)0x0) {
              if (top_blob->data != (void *)0x0) {
                free(top_blob->data);
              }
            }
            else {
              (*top_blob->allocator->_vptr_Allocator[3])();
            }
          }
        }
        top_blob->cstep = 0;
        top_blob->data = (void *)0x0;
        top_blob->refcount = (int *)0x0;
        *(undefined8 *)((long)&top_blob->refcount + 4) = 0;
        *(undefined8 *)((long)&top_blob->elemsize + 4) = 0;
        top_blob->dims = 0;
        top_blob->w = 0;
        top_blob->h = 0;
        top_blob->d = 0;
        top_blob->c = 0;
        top_blob->data = local_78.data;
        top_blob->refcount = local_78.refcount;
        top_blob->elemsize = local_78.elemsize;
        top_blob->elempack = local_78.elempack;
        top_blob->allocator = local_78.allocator;
        top_blob->dims = local_78.dims;
        top_blob->w = local_78.w;
        top_blob->h = local_78.h;
        top_blob->d = local_78.d;
        top_blob->c = local_78.c;
        top_blob->cstep = local_78.cstep;
      }
      if (local_78.refcount == (int *)0x0) goto LAB_00473a2f;
      LOCK();
      *local_78.refcount = *local_78.refcount + -1;
      UNLOCK();
      if (*local_78.refcount != 0) goto LAB_00473a2f;
      if (local_78.allocator != (Allocator *)0x0) {
        (*(local_78.allocator)->_vptr_Allocator[3])();
        goto LAB_00473a2f;
      }
    }
    if (local_78.data != (void *)0x0) {
      free(local_78.data);
    }
    goto LAB_00473a2f;
  }
  if (bVar13) {
    Mat::reshape(&local_78,bottom_blob,1,iVar10,_h,opt->blob_allocator);
    if (&local_78 != top_blob) {
      if (local_78.refcount != (int *)0x0) {
        LOCK();
        *local_78.refcount = *local_78.refcount + 1;
        UNLOCK();
      }
      piVar2 = top_blob->refcount;
      if (piVar2 != (int *)0x0) {
        LOCK();
        *piVar2 = *piVar2 + -1;
        UNLOCK();
        if (*piVar2 == 0) {
          if (top_blob->allocator == (Allocator *)0x0) {
            if (top_blob->data != (void *)0x0) {
              free(top_blob->data);
            }
          }
          else {
            (*top_blob->allocator->_vptr_Allocator[3])();
          }
        }
      }
      top_blob->cstep = 0;
      top_blob->data = (void *)0x0;
      top_blob->refcount = (int *)0x0;
      *(undefined8 *)((long)&top_blob->refcount + 4) = 0;
      *(undefined8 *)((long)&top_blob->elemsize + 4) = 0;
      top_blob->dims = 0;
      top_blob->w = 0;
      top_blob->h = 0;
      top_blob->d = 0;
      top_blob->c = 0;
      top_blob->data = local_78.data;
      top_blob->refcount = local_78.refcount;
      top_blob->elemsize = local_78.elemsize;
      top_blob->elempack = local_78.elempack;
      top_blob->allocator = local_78.allocator;
      top_blob->dims = local_78.dims;
      top_blob->w = local_78.w;
      top_blob->h = local_78.h;
      top_blob->d = local_78.d;
      top_blob->c = local_78.c;
      top_blob->cstep = local_78.cstep;
    }
    if (local_78.refcount == (int *)0x0) goto LAB_00473a2f;
    LOCK();
    *local_78.refcount = *local_78.refcount + -1;
    UNLOCK();
    if (*local_78.refcount != 0) goto LAB_00473a2f;
    if (local_78.allocator != (Allocator *)0x0) {
      (*(local_78.allocator)->_vptr_Allocator[3])();
      goto LAB_00473a2f;
    }
  }
  else if (bVar14) {
    Mat::reshape(&local_78,bottom_blob,iVar10,1,_h,opt->blob_allocator);
    if (&local_78 != top_blob) {
      if (local_78.refcount != (int *)0x0) {
        LOCK();
        *local_78.refcount = *local_78.refcount + 1;
        UNLOCK();
      }
      piVar2 = top_blob->refcount;
      if (piVar2 != (int *)0x0) {
        LOCK();
        *piVar2 = *piVar2 + -1;
        UNLOCK();
        if (*piVar2 == 0) {
          if (top_blob->allocator == (Allocator *)0x0) {
            if (top_blob->data != (void *)0x0) {
              free(top_blob->data);
            }
          }
          else {
            (*top_blob->allocator->_vptr_Allocator[3])();
          }
        }
      }
      top_blob->cstep = 0;
      top_blob->data = (void *)0x0;
      top_blob->refcount = (int *)0x0;
      *(undefined8 *)((long)&top_blob->refcount + 4) = 0;
      *(undefined8 *)((long)&top_blob->elemsize + 4) = 0;
      top_blob->dims = 0;
      top_blob->w = 0;
      top_blob->h = 0;
      top_blob->d = 0;
      top_blob->c = 0;
      top_blob->data = local_78.data;
      top_blob->refcount = local_78.refcount;
      top_blob->elemsize = local_78.elemsize;
      top_blob->elempack = local_78.elempack;
      top_blob->allocator = local_78.allocator;
      top_blob->dims = local_78.dims;
      top_blob->w = local_78.w;
      top_blob->h = local_78.h;
      top_blob->d = local_78.d;
      top_blob->c = local_78.c;
      top_blob->cstep = local_78.cstep;
    }
    if (local_78.refcount == (int *)0x0) goto LAB_00473a2f;
    LOCK();
    *local_78.refcount = *local_78.refcount + -1;
    UNLOCK();
    if (*local_78.refcount != 0) goto LAB_00473a2f;
    if (local_78.allocator != (Allocator *)0x0) {
      (*(local_78.allocator)->_vptr_Allocator[3])();
      goto LAB_00473a2f;
    }
  }
  else {
    if (!bVar15) goto LAB_00473a2f;
    Mat::reshape(&local_78,bottom_blob,iVar10,_h,1,opt->blob_allocator);
    if (&local_78 != top_blob) {
      if (local_78.refcount != (int *)0x0) {
        LOCK();
        *local_78.refcount = *local_78.refcount + 1;
        UNLOCK();
      }
      piVar2 = top_blob->refcount;
      if (piVar2 != (int *)0x0) {
        LOCK();
        *piVar2 = *piVar2 + -1;
        UNLOCK();
        if (*piVar2 == 0) {
          if (top_blob->allocator == (Allocator *)0x0) {
            if (top_blob->data != (void *)0x0) {
              free(top_blob->data);
            }
          }
          else {
            (*top_blob->allocator->_vptr_Allocator[3])();
          }
        }
      }
      top_blob->cstep = 0;
      top_blob->data = (void *)0x0;
      top_blob->refcount = (int *)0x0;
      *(undefined8 *)((long)&top_blob->refcount + 4) = 0;
      *(undefined8 *)((long)&top_blob->elemsize + 4) = 0;
      top_blob->dims = 0;
      top_blob->w = 0;
      top_blob->h = 0;
      top_blob->d = 0;
      top_blob->c = 0;
      top_blob->data = local_78.data;
      top_blob->refcount = local_78.refcount;
      top_blob->elemsize = local_78.elemsize;
      top_blob->elempack = local_78.elempack;
      top_blob->allocator = local_78.allocator;
      top_blob->dims = local_78.dims;
      top_blob->w = local_78.w;
      top_blob->h = local_78.h;
      top_blob->d = local_78.d;
      top_blob->c = local_78.c;
      top_blob->cstep = local_78.cstep;
    }
    if (local_78.refcount == (int *)0x0) goto LAB_00473a2f;
    LOCK();
    *local_78.refcount = *local_78.refcount + -1;
    UNLOCK();
    if (*local_78.refcount != 0) goto LAB_00473a2f;
    if (local_78.allocator != (Allocator *)0x0) {
      (*(local_78.allocator)->_vptr_Allocator[3])();
      goto LAB_00473a2f;
    }
  }
  if (local_78.data != (void *)0x0) {
    free(local_78.data);
  }
LAB_00473a2f:
  if (top_blob->data == (void *)0x0) {
    iVar8 = -100;
  }
  else {
    iVar8 = -100;
    if ((long)top_blob->c * top_blob->cstep != 0) {
      iVar8 = 0;
    }
  }
  return iVar8;
}

Assistant:

int ExpandDims::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int dims = bottom_blob.dims;

    bool _expand_w = false;
    bool _expand_h = false;
    bool _expand_c = false;

    if (axes.empty())
    {
        _expand_w = expand_w;
        _expand_h = expand_h;
        _expand_c = expand_c;
    }
    else
    {
        const int* axes_ptr = axes;
        for (int i = 0; i < axes.w; i++)
        {
            int axis = axes_ptr[i];
            if (axis < 0)
                axis = dims + 1 + axis;

            if (dims == 1 && axis == 0)
            {
                _expand_h = true;
            }
            if (dims == 1 && axis == 1)
            {
                _expand_w = true;
            }
            if (dims == 2 && axis == 0)
            {
                _expand_c = true;
            }
            if (dims == 2 && axis == 1)
            {
                _expand_h = true;
            }
            if (dims == 2 && axis == 2)
            {
                _expand_w = true;
            }
        }
    }

    top_blob = bottom_blob;

    if (dims == 1)
    {
        if (_expand_w && _expand_h)
        {
            top_blob = bottom_blob.reshape(1, w, 1, opt.blob_allocator);
        }
        else if (_expand_w)
        {
            top_blob = bottom_blob.reshape(1, w, opt.blob_allocator);
        }
        else if (_expand_h)
        {
            top_blob = bottom_blob.reshape(w, 1, opt.blob_allocator);
        }
    }

    if (dims == 2)
    {
        if (_expand_w)
        {
            top_blob = bottom_blob.reshape(1, w, h, opt.blob_allocator);
        }
        else if (_expand_h)
        {
            top_blob = bottom_blob.reshape(w, 1, h, opt.blob_allocator);
        }
        else if (_expand_c)
        {
            top_blob = bottom_blob.reshape(w, h, 1, opt.blob_allocator);
        }
    }

    if (top_blob.empty())
        return -100;

    return 0;
}